

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_set_variant_type(char *ref,char *alt,variant_t *var)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_50;
  char *local_40;
  char *ae;
  char *re;
  char *a;
  char *r;
  variant_t *var_local;
  char *alt_local;
  char *ref_local;
  
  if ((ref[1] == '\0') && (alt[1] == '\0')) {
    if ((*alt == '.') || (*ref == *alt)) {
      var->n = 0;
      var->type = 0;
    }
    else if (*alt == 'X') {
      var->n = 0;
      var->type = 0;
    }
    else {
      var->n = 1;
      var->type = 1;
    }
  }
  else {
    re = alt;
    a = ref;
    if (*alt == '<') {
      if ((alt[1] == 'X') && (alt[2] == '>')) {
        var->n = 0;
        var->type = 0;
      }
      else {
        var->type = 8;
      }
    }
    else {
      while( true ) {
        bVar4 = false;
        if ((*a != '\0') && (bVar4 = false, *re != '\0')) {
          bVar4 = *a == *re;
        }
        if (!bVar4) break;
        a = a + 1;
        re = re + 1;
      }
      iVar1 = (int)a;
      if ((*re == '\0') || (*a != '\0')) {
        iVar2 = (int)re;
        if ((*a == '\0') || (*re != '\0')) {
          if ((*a == '\0') && (*re == '\0')) {
            var->n = 0;
            var->type = 0;
          }
          else {
            local_40 = re;
            for (ae = a; ae[1] != '\0'; ae = ae + 1) {
            }
            for (; local_40[1] != '\0'; local_40 = local_40 + 1) {
            }
            while( true ) {
              bVar4 = false;
              if ((*ae == *local_40) && (bVar4 = false, a < ae)) {
                bVar4 = re < local_40;
              }
              if (!bVar4) break;
              ae = ae + -1;
              local_40 = local_40 + -1;
            }
            if (local_40 == re) {
              if (ae == a) {
                var->n = 1;
                var->type = 1;
              }
              else {
                var->n = -((int)ae - iVar1);
                if (*ae == *local_40) {
                  var->type = 4;
                }
                else {
                  var->type = 8;
                }
              }
            }
            else if (ae == a) {
              var->n = (int)local_40 - iVar2;
              if (*ae == *local_40) {
                var->type = 4;
              }
              else {
                var->type = 8;
              }
            }
            else {
              iVar3 = 8;
              if ((long)ae - (long)a == (long)local_40 - (long)re) {
                iVar3 = 2;
              }
              var->type = iVar3;
              if ((long)local_40 - (long)re < (long)ae - (long)a) {
                local_50 = -(((int)ae - iVar1) + 1);
              }
              else {
                local_50 = ((int)local_40 - iVar2) + 1;
              }
              var->n = local_50;
            }
          }
        }
        else {
          for (; *a != '\0'; a = a + 1) {
          }
          var->n = (iVar2 - (int)alt) - ((int)a - (int)ref);
          var->type = 4;
        }
      }
      else {
        for (; *re != '\0'; re = re + 1) {
        }
        var->n = ((int)re - (int)alt) - (iVar1 - (int)ref);
        var->type = 4;
      }
    }
  }
  return;
}

Assistant:

static void bcf_set_variant_type(const char *ref, const char *alt, variant_t *var)
{
    // The most frequent case
    if ( !ref[1] && !alt[1] )
    {
        if ( *alt == '.' || *ref==*alt ) { var->n = 0; var->type = VCF_REF; return; }
        if ( *alt == 'X' ) { var->n = 0; var->type = VCF_REF; return; }  // mpileup's X allele shouldn't be treated as variant
        var->n = 1; var->type = VCF_SNP; return;
    }
    if ( alt[0]=='<' )
    {
        if ( alt[1]=='X' && alt[2]=='>' ) { var->n = 0; var->type = VCF_REF; return; }  // mpileup's X allele shouldn't be treated as variant
        var->type = VCF_OTHER;
        return;
    }

    const char *r = ref, *a = alt;
    while (*r && *a && *r==*a ) { r++; a++; }

    if ( *a && !*r )
    {
        while ( *a ) a++;
        var->n = (a-alt)-(r-ref); var->type = VCF_INDEL; return;
    }
    else if ( *r && !*a )
    {
        while ( *r ) r++;
        var->n = (a-alt)-(r-ref); var->type = VCF_INDEL; return;
    }
    else if ( !*r && !*a )
    {
        var->n = 0; var->type = VCF_REF; return;
    }

    const char *re = r, *ae = a;
    while ( re[1] ) re++;
    while ( ae[1] ) ae++;
    while ( *re==*ae && re>r && ae>a ) { re--; ae--; }
    if ( ae==a )
    {
        if ( re==r ) { var->n = 1; var->type = VCF_SNP; return; }
        var->n = -(re-r);
        if ( *re==*ae ) { var->type = VCF_INDEL; return; }
        var->type = VCF_OTHER; return;
    }
    else if ( re==r )
    {
        var->n = ae-a;
        if ( *re==*ae ) { var->type = VCF_INDEL; return; }
        var->type = VCF_OTHER; return;
    }

    var->type = ( re-r == ae-a ) ? VCF_MNP : VCF_OTHER;
    var->n = ( re-r > ae-a ) ? -(re-r+1) : ae-a+1;

    // should do also complex events, SVs, etc...
}